

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int validate_pattern(ly_ctx *ctx,char *val_str,lys_type *type,lyd_node *node)

{
  char cVar1;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  int iVar5;
  size_t sVar6;
  lys_node_leaf *plVar7;
  void **ppvVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  char *val_str_00;
  
  if ((ctx == (ly_ctx *)0x0) || (type->base != LY_TYPE_STRING)) {
    __assert_fail("ctx && (type->base == LY_TYPE_STRING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                  ,0x263,
                  "int validate_pattern(struct ly_ctx *, const char *, struct lys_type *, struct lyd_node *)"
                 );
  }
  val_str_00 = "";
  if (val_str != (char *)0x0) {
    val_str_00 = val_str;
  }
  if ((type->der == (lys_tpdf *)0x0) ||
     (iVar5 = validate_pattern(ctx,val_str_00,&type->der->type,node), iVar5 == 0)) {
    if (((type->info).str.patterns_pcre != (void **)0x0) ||
       (uVar9 = (type->info).str.pat_count, uVar9 == 0)) {
LAB_00124b6a:
      uVar11 = 1;
      lVar12 = 0;
      uVar10 = 0;
      do {
        if ((type->info).str.pat_count <= uVar10) {
          return 0;
        }
        ppvVar8 = (type->info).str.patterns_pcre;
        pvVar2 = ppvVar8[(int)uVar11 - 1];
        pvVar3 = ppvVar8[uVar11];
        sVar6 = strlen(val_str_00);
        iVar5 = pcre_exec(pvVar2,pvVar3,val_str_00,sVar6 & 0xffffffff,0,0,0,0);
        plVar7 = (type->info).lref.target;
        cVar1 = **(char **)(plVar7->padding + lVar12 + -0x1c);
        if (iVar5 == 0) {
          if (cVar1 == '\x15') goto LAB_00124bfa;
        }
        else if (cVar1 == '\x06') {
LAB_00124bfa:
          ly_vlog(ctx,LYE_NOCONSTR,LY_VLOG_LYD,node,val_str_00,
                  *(long *)(plVar7->padding + lVar12 + -0x1c) + 1);
          plVar7 = (type->info).lref.target;
          if (*(char **)(plVar7->padding + lVar12 + 4) != (char *)0x0) {
            ly_vlog_str(ctx,LY_VLOG_PREV,*(char **)(plVar7->padding + lVar12 + 4));
            plVar7 = (type->info).lref.target;
          }
          if (*(char **)(plVar7->padding + lVar12 + -4) == (char *)0x0) {
            return 1;
          }
          ly_err_last_set_apptag(ctx,*(char **)(plVar7->padding + lVar12 + -4));
          return 1;
        }
        uVar10 = uVar10 + 1;
        lVar12 = lVar12 + 0x38;
        uVar11 = (ulong)((int)uVar11 + 2);
      } while( true );
    }
    ppvVar8 = (void **)malloc((ulong)(uVar9 * 2) << 3);
    (type->info).str.patterns_pcre = ppvVar8;
    if (ppvVar8 == (void **)0x0) {
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","validate_pattern");
      return -1;
    }
    uVar11 = 0xffffffffffffffff;
    lVar12 = 0;
    uVar9 = 1;
    do {
      uVar11 = uVar11 + 1;
      if ((type->info).str.pat_count <= uVar11) goto LAB_00124b6a;
      ppvVar8 = (type->info).str.patterns_pcre;
      lVar4 = lVar12 + -0x1c;
      lVar12 = lVar12 + 0x38;
      iVar5 = lyp_precompile_pattern
                        (ctx,(char *)(*(long *)(((type->info).lref.target)->padding + lVar4) + 1),
                         (pcre **)(ppvVar8 + (uVar9 - 1)),(pcre_extra **)(ppvVar8 + uVar9));
      uVar9 = uVar9 + 2;
    } while (iVar5 == 0);
  }
  return 1;
}

Assistant:

static int
validate_pattern(struct ly_ctx *ctx, const char *val_str, struct lys_type *type, struct lyd_node *node)
{
    int rc;
    unsigned int i;
#ifndef LY_ENABLED_CACHE
    pcre *precomp;
#endif

    assert(ctx && (type->base == LY_TYPE_STRING));

    if (!val_str) {
        val_str = "";
    }

    if (type->der && validate_pattern(ctx, val_str, &type->der->type, node)) {
        return EXIT_FAILURE;
    }

#ifdef LY_ENABLED_CACHE
    /* there is no cache, build it */
    if (!type->info.str.patterns_pcre && type->info.str.pat_count) {
        type->info.str.patterns_pcre = malloc(2 * type->info.str.pat_count * sizeof *type->info.str.patterns_pcre);
        LY_CHECK_ERR_RETURN(!type->info.str.patterns_pcre, LOGMEM(ctx), -1);

        for (i = 0; i < type->info.str.pat_count; ++i) {
            if (lyp_precompile_pattern(ctx, &type->info.str.patterns[i].expr[1],
                                       (pcre**)&type->info.str.patterns_pcre[i * 2],
                                       (pcre_extra**)&type->info.str.patterns_pcre[i * 2 + 1])) {
                return EXIT_FAILURE;
            }
        }
    }
#endif

    for (i = 0; i < type->info.str.pat_count; ++i) {
#ifdef LY_ENABLED_CACHE
        rc = pcre_exec((pcre *)type->info.str.patterns_pcre[2 * i], (pcre_extra *)type->info.str.patterns_pcre[2 * i + 1],
                       val_str, strlen(val_str), 0, 0, NULL, 0);
#else
        if (lyp_check_pattern(ctx, &type->info.str.patterns[i].expr[1], &precomp)) {
            return EXIT_FAILURE;
        }
        rc = pcre_exec(precomp, NULL, val_str, strlen(val_str), 0, 0, NULL, 0);
        free(precomp);
#endif
        if ((rc && type->info.str.patterns[i].expr[0] == 0x06) || (!rc && type->info.str.patterns[i].expr[0] == 0x15)) {
            LOGVAL(ctx, LYE_NOCONSTR, LY_VLOG_LYD, node, val_str, &type->info.str.patterns[i].expr[1]);
            if (type->info.str.patterns[i].emsg) {
                ly_vlog_str(ctx, LY_VLOG_PREV, type->info.str.patterns[i].emsg);
            }
            if (type->info.str.patterns[i].eapptag) {
                ly_err_last_set_apptag(ctx, type->info.str.patterns[i].eapptag);
            }
            return EXIT_FAILURE;
        }
    }

    return EXIT_SUCCESS;
}